

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::asio_rpc_listener::remove_session(asio_rpc_listener *this,ptr<rpc_session> *session)

{
  bool bVar1;
  vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
  *in_RDI;
  iterator it;
  lock_guard<std::mutex> guard;
  mutex_type *in_stack_ffffffffffffff98;
  shared_ptr<nuraft::rpc_session> *in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffb8;
  __normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
  local_20 [4];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20[0]._M_current =
       (shared_ptr<nuraft::rpc_session> *)
       std::
       vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
       ::begin((vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
                *)in_stack_ffffffffffffff98);
  do {
    std::
    vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
    ::end((vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
           *)in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
LAB_001db316:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1db320);
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
    ::operator*(local_20);
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,
                            (shared_ptr<nuraft::rpc_session> *)in_stack_ffffffffffffff98);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<nuraft::rpc_session>const*,std::vector<std::shared_ptr<nuraft::rpc_session>,std::allocator<std::shared_ptr<nuraft::rpc_session>>>>
      ::__normal_iterator<std::shared_ptr<nuraft::rpc_session>*>
                ((__normal_iterator<const_std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
                  *)&in_RDI[8].
                     super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
                  *)in_stack_ffffffffffffff98);
      std::
      vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
      ::erase(in_RDI,in_stack_ffffffffffffffb8);
      goto LAB_001db316;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<nuraft::rpc_session>_*,_std::vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>_>
    ::operator++(local_20);
  } while( true );
}

Assistant:

void remove_session(const ptr<rpc_session>& session) {
        auto_lock(session_lock_);

        for (auto it = active_sessions_.begin();
             it != active_sessions_.end(); ++it) {
            if (*it == session) {
                active_sessions_.erase(it);
                break;
            }
        }
    }